

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4.cc
# Opt level: O3

int lf::io::NumNodes(ElementType et)

{
  runtime_error *this;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  switch(et) {
  case EDGE2:
    et = TRIA3;
    break;
  case TRIA3:
  case EDGE3:
    et = QUAD4;
    break;
  case QUAD4:
  case TET4:
  case EDGE4:
    et = TET4;
    break;
  case HEX8:
  case QUAD8:
    et = EDGE3;
    break;
  case PRISM6:
  case PYRAMID14:
    break;
  case PYRAMID5:
  case EDGE5:
    et = HEX8;
    break;
  case TRIA6:
  case EDGE6:
    et = PRISM6;
    break;
  case QUAD9:
  case TRIA9:
    et = TRIA6;
    break;
  case TET10:
  case TRIA10:
    et = QUAD9;
    break;
  case HEX27:
    et = EDGE5;
    break;
  case PRISM18:
    et = PRISM15;
    break;
  case POINT:
    et = EDGE2;
    break;
  case HEX20:
  case TET20:
    et = TRIA9;
    break;
  case PRISM15:
  case TRIA15:
  case TRIA15_5:
    et = POINT;
    break;
  case PYRAMID13:
    et = PRISM18;
    break;
  case TRIA12:
    et = HEX27;
    break;
  case TRIA21:
    et = TRIA10;
    break;
  case TET35:
    et = 0x23;
    break;
  case TET56:
    et = 0x38;
    break;
  default:
    if (et == HEX64) {
      et = 0x40;
    }
    else {
      if (et != HEX125) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"unknown Gmsh element type",0x19);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_1e0,&local_200,0xbf,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"this code should not be reached");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      et = 0x7d;
    }
  }
  return et;
}

Assistant:

int NumNodes(GMshFileV4::ElementType et) {
  switch (et) {
    default:
      break;
    case GMshFileV4::ElementType::EDGE2:
      return 2;
    case GMshFileV4::ElementType::TRIA3:
      return 3;
    case GMshFileV4::ElementType::QUAD4:
    case GMshFileV4::ElementType::TET4:
      return 4;
    case GMshFileV4::ElementType::HEX8:
      return 8;
    case GMshFileV4::ElementType::PRISM6:
      return 6;
    case GMshFileV4::ElementType::PYRAMID5:
      return 5;
    case GMshFileV4::ElementType::EDGE3:
      return 3;
    case GMshFileV4::ElementType::TRIA6:
      return 6;
    case GMshFileV4::ElementType::QUAD9:
      return 9;
    case GMshFileV4::ElementType::TET10:
      return 10;
    case GMshFileV4::ElementType::HEX27:
      return 27;
    case GMshFileV4::ElementType::PRISM18:
      return 18;
    case GMshFileV4::ElementType::PYRAMID14:
      return 14;
    case GMshFileV4::ElementType::POINT:
      return 1;
    case GMshFileV4::ElementType::QUAD8:
      return 8;
    case GMshFileV4::ElementType::HEX20:
      return 20;
    case GMshFileV4::ElementType::PRISM15:
      return 15;
    case GMshFileV4::ElementType::PYRAMID13:
      return 13;
    case GMshFileV4::ElementType::TRIA9:
      return 9;
    case GMshFileV4::ElementType::TRIA10:
      return 10;
    case GMshFileV4::ElementType::TRIA12:
      return 12;
    case GMshFileV4::ElementType::TRIA15:
    case GMshFileV4::ElementType::TRIA15_5:
      return 15;
    case GMshFileV4::ElementType::TRIA21:
      return 21;
    case GMshFileV4::ElementType::EDGE4:
      return 4;
    case GMshFileV4::ElementType::EDGE5:
      return 5;
    case GMshFileV4::ElementType::EDGE6:
      return 6;
    case GMshFileV4::ElementType::TET20:
      return 20;
    case GMshFileV4::ElementType::TET35:
      return 35;
    case GMshFileV4::ElementType::TET56:
      return 56;
    case GMshFileV4::ElementType::HEX64:
      return 64;
    case GMshFileV4::ElementType::HEX125:
      return 125;
  }
  LF_VERIFY_MSG(false, "unknown Gmsh element type");
  // Make compiler happy:
  return 0;
}